

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngvalid.c
# Opt level: O0

void sBIT_error_fn(png_structp pp,png_infop pi)

{
  char cVar1;
  char local_1e;
  char local_1d;
  char local_1c;
  char local_1b;
  char local_1a;
  char local_19;
  png_color_8 bad;
  png_infop ppStack_18;
  png_byte bit_depth;
  png_infop pi_local;
  png_structp pp_local;
  
  ppStack_18 = pi;
  cVar1 = png_get_color_type(pp,pi);
  if (cVar1 == '\x03') {
    local_19 = '\b';
  }
  else {
    local_19 = png_get_bit_depth(pp,ppStack_18);
  }
  local_1e = local_19 + '\x01';
  local_1d = local_1e;
  local_1c = local_1e;
  local_1b = local_1e;
  local_1a = local_1e;
  png_set_sBIT(pp,ppStack_18,&local_1e);
  return;
}

Assistant:

static void
sBIT_error_fn(png_structp pp, png_infop pi)
{
   png_byte bit_depth;
   png_color_8 bad;

   if (png_get_color_type(pp, pi) == PNG_COLOR_TYPE_PALETTE)
      bit_depth = 8;

   else
      bit_depth = png_get_bit_depth(pp, pi);

   /* Now we know the bit depth we can easily generate an invalid sBIT entry */
   bad.red = bad.green = bad.blue = bad.gray = bad.alpha =
      (png_byte)(bit_depth+1);
   png_set_sBIT(pp, pi, &bad);
}